

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsBrokerGlobalError(HelicsBroker broker,int errorCode,char *errorString,HelicsError *err)

{
  Broker *pBVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  
  pBVar1 = getBroker(broker,err);
  if (pBVar1 == (Broker *)0x0) {
    return;
  }
  sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  if (errorString != (char *)0x0) {
    sVar2 = strlen(errorString);
    _Var3._M_p = errorString;
  }
  (*pBVar1->_vptr_Broker[0x1c])(pBVar1,errorCode,sVar2,_Var3._M_p);
  return;
}

Assistant:

void helicsBrokerGlobalError(HelicsBroker broker, int errorCode, const char* errorString, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    brk->globalError(errorCode, AS_STRING_VIEW(errorString));
}